

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsMakeUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)22>_> *
vkt::FragmentOperations::makeDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkDescriptorPool descriptorPool,VkDescriptorSetLayout setLayout)

{
  VkDescriptorSetAllocateInfo info;
  VkDescriptorSetLayout local_38;
  VkDescriptorSetAllocateInfo local_30;
  
  local_30.pSetLayouts = &local_38;
  local_30.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_30.pNext = (void *)0x0;
  local_30.descriptorSetCount = 1;
  local_38.m_internal = setLayout.m_internal;
  local_30.descriptorPool.m_internal = descriptorPool.m_internal;
  ::vk::allocateDescriptorSet(__return_storage_ptr__,vk,device,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSet> makeDescriptorSet (const DeviceInterface&			vk,
										 const VkDevice					device,
										 const VkDescriptorPool			descriptorPool,
										 const VkDescriptorSetLayout	setLayout)
{
	const VkDescriptorSetAllocateInfo info =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		descriptorPool,										// VkDescriptorPool				descriptorPool;
		1u,													// deUint32						descriptorSetCount;
		&setLayout,											// const VkDescriptorSetLayout*	pSetLayouts;
	};
	return allocateDescriptorSet(vk, device, &info);
}